

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  float x0;
  float y0;
  undefined2 uVar1;
  undefined2 uVar3;
  undefined4 uVar4;
  ImVec2 IVar2;
  char cVar5;
  ImWchar c;
  int iVar6;
  int iVar7;
  uint uVar8;
  ImFontAtlasCustomRect *pIVar9;
  ImFont *pIVar10;
  undefined1 auVar11 [16];
  ImFontGlyph *pIVar12;
  long lVar13;
  int i;
  int iVar14;
  long lVar15;
  long lVar16;
  ulong uVar17;
  int i_1;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  ImVec2 local_48;
  ImVec2 local_40;
  ulong local_38;
  
  iVar6 = atlas->CustomRectIds[0];
  iVar7 = atlas->TexWidth;
  pIVar9 = (atlas->CustomRects).Data;
  if ((atlas->Flags & 2) == 0) {
    lVar13 = 0;
    for (iVar14 = 0; iVar14 != 0x1b; iVar14 = iVar14 + 1) {
      for (lVar15 = 0; (int)lVar15 != 0x6c; lVar15 = lVar15 + 1) {
        cVar5 = "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                [(int)lVar13 + lVar15];
        lVar16 = (long)(int)((uint)pIVar9[iVar6].X + (int)lVar15 +
                            ((uint)pIVar9[iVar6].Y + iVar14) * iVar7);
        atlas->TexPixelsAlpha8[lVar16] = -(cVar5 == '.');
        atlas->TexPixelsAlpha8[lVar16 + 0x6d] = -(cVar5 == 'X');
      }
      lVar13 = (int)lVar13 + lVar15;
    }
  }
  else {
    lVar15 = (ulong)pIVar9[iVar6].Y * (long)iVar7 + (ulong)pIVar9[iVar6].X;
    lVar13 = (long)(iVar7 + (int)lVar15);
    atlas->TexPixelsAlpha8[lVar13 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar13] = 0xff;
    atlas->TexPixelsAlpha8[lVar15 + 1] = 0xff;
    atlas->TexPixelsAlpha8[lVar15] = 0xff;
  }
  pIVar9 = pIVar9 + iVar6;
  uVar1 = pIVar9->X;
  uVar3 = pIVar9->Y;
  uVar4 = pIVar9->GlyphAdvanceX;
  auVar18._4_4_ = uVar4;
  auVar18._2_2_ = uVar3;
  auVar18._0_2_ = uVar1;
  auVar18._8_8_ = 0;
  auVar18 = vpmovzxwd_avx(auVar18);
  lVar15 = 0;
  lVar13 = 0;
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar11._8_4_ = 0x3f000000;
  auVar11._0_8_ = 0x3f0000003f000000;
  auVar11._12_4_ = 0x3f000000;
  auVar18 = vaddps_avx512vl(auVar18,auVar11);
  auVar19._0_4_ = (atlas->TexUvScale).x * auVar18._0_4_;
  auVar19._4_4_ = (atlas->TexUvScale).y * auVar18._4_4_;
  auVar19._8_4_ = auVar18._8_4_ * 0.0;
  auVar19._12_4_ = auVar18._12_4_ * 0.0;
  IVar2 = (ImVec2)vmovlps_avx(auVar19);
  atlas->TexUvWhitePixel = IVar2;
  for (; lVar13 < (atlas->CustomRects).Size; lVar13 = lVar13 + 1) {
    pIVar9 = (atlas->CustomRects).Data;
    pIVar10 = *(ImFont **)((long)&pIVar9->Font + lVar15);
    uVar8 = *(uint *)((long)&pIVar9->ID + lVar15);
    if (uVar8 < 0x110000 && pIVar10 != (ImFont *)0x0) {
      local_40.x = 0.0;
      local_40.y = 0.0;
      local_48.x = 0.0;
      local_48.y = 0.0;
      ImFontAtlas::CalcCustomRectUV
                (atlas,(ImFontAtlasCustomRect *)((long)&pIVar9->ID + lVar15),&local_40,&local_48);
      x0 = *(float *)((long)&(pIVar9->GlyphOffset).x + lVar15);
      y0 = *(float *)((long)&(pIVar9->GlyphOffset).y + lVar15);
      ImFont::AddGlyph(pIVar10,(ImWchar)uVar8,x0,y0,
                       x0 + (float)*(ushort *)((long)&pIVar9->Width + lVar15),
                       y0 + (float)*(ushort *)((long)&pIVar9->Height + lVar15),local_40.x,local_40.y
                       ,local_48.x,local_48.y,*(float *)((long)&pIVar9->GlyphAdvanceX + lVar15));
    }
    lVar15 = lVar15 + 0x20;
  }
  for (lVar13 = 0; uVar8 = (atlas->Fonts).Size, lVar13 < (int)uVar8; lVar13 = lVar13 + 1) {
    pIVar10 = (atlas->Fonts).Data[lVar13];
    if (pIVar10->DirtyLookupTables == true) {
      ImFont::BuildLookupTable(pIVar10);
    }
  }
  uVar17 = 0;
  local_38 = (ulong)(~((int)uVar8 >> 0x1f) & uVar8);
  do {
    if (uVar17 == local_38) {
      return;
    }
    pIVar10 = (atlas->Fonts).Data[uVar17];
    if (pIVar10->EllipsisChar == 0xffff) {
      lVar13 = 0;
      do {
        if (lVar13 == 4) goto LAB_00206c86;
        c = *(ImWchar *)((long)&DAT_003e4ad4 + lVar13);
        pIVar12 = ImFont::FindGlyphNoFallback(pIVar10,c);
        lVar13 = lVar13 + 2;
      } while (pIVar12 == (ImFontGlyph *)0x0);
      pIVar10->EllipsisChar = c;
    }
LAB_00206c86:
    uVar17 = uVar17 + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data block
    ImFontAtlasBuildRenderDefaultTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect& r = atlas->CustomRects[i];
        if (r.Font == NULL || r.ID >= 0x110000)
            continue;

        IM_ASSERT(r.Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(&r, &uv0, &uv1);
        r.Font->AddGlyph((ImWchar)r.ID, r.GlyphOffset.x, r.GlyphOffset.y, r.GlyphOffset.x + r.Width, r.GlyphOffset.y + r.Height, uv0.x, uv0.y, uv1.x, uv1.y, r.GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    // Ellipsis character is required for rendering elided text. We prefer using U+2026 (horizontal ellipsis).
    // However some old fonts may contain ellipsis at U+0085. Here we auto-detect most suitable ellipsis character.
    // FIXME: Also note that 0x2026 is currently seldomly included in our font ranges. Because of this we are more likely to use three individual dots.
    for (int i = 0; i < atlas->Fonts.size(); i++)
    {
        ImFont* font = atlas->Fonts[i];
        if (font->EllipsisChar != (ImWchar)-1)
            continue;
        const ImWchar ellipsis_variants[] = { (ImWchar)0x2026, (ImWchar)0x0085 };
        for (int j = 0; j < IM_ARRAYSIZE(ellipsis_variants); j++)
            if (font->FindGlyphNoFallback(ellipsis_variants[j]) != NULL) // Verify glyph exists
            {
                font->EllipsisChar = ellipsis_variants[j];
                break;
            }
    }
}